

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template1.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
	cout << Factorial<5>::v << endl;    // 120
	cout << Factorial<1>::v << endl;    // 1
	cout << Factorial<0>::v << endl;    // 0
}